

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

StackTrace *
Js::JavascriptExceptionOperators::TrimStackTraceForThrownObject
          (StackTrace *stackTraceIn,Var thrownObject,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  uint64 uVar7;
  Recycler *pRVar8;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar9;
  Type *item;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  int i;
  TrackAllocData local_78;
  AutoNestedHandledExceptionType local_40 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  StackTrace *stackTraceTrimmed;
  int stackTraceLimit;
  ScriptContext *scriptContext_local;
  Var thrownObject_local;
  StackTrace *stackTraceIn_local;
  
  bVar2 = CrawlStackForWER(scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x584,"(CrawlStackForWER(scriptContext))","CrawlStackForWER(scriptContext)")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (stackTraceIn == (StackTrace *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x585,"(stackTraceIn)","stackTraceIn");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar7 = GetStackTraceLimit(thrownObject,scriptContext);
  iVar3 = (int)uVar7;
  if ((iVar3 != 0) && (bVar2 = IsErrorInstance(thrownObject), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x588,"(stackTraceLimit == 0 || IsErrorInstance(thrownObject))",
                       "stackTraceLimit == 0 || IsErrorInstance(thrownObject)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar4 = JsUtil::
          ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
          ::Count(&stackTraceIn->
                   super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                 );
  stackTraceIn_local = stackTraceIn;
  if (iVar3 < iVar4) {
    ___autoNestedHandledExceptionType =
         (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    if (0 < iVar3) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_40,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                          ExceptionType_OutOfMemory);
      pRVar8 = ScriptContext::GetRecycler(scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,
                 (type_info *)
                 &JsUtil::
                  List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                 ,0x595);
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_78);
      pLVar9 = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)new<Memory::Recycler>(0x30,pRVar8,0x43c4b0);
      pRVar8 = ScriptContext::GetRecycler(scriptContext);
      JsUtil::
      List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::List(pLVar9,pRVar8,4);
      ___autoNestedHandledExceptionType = pLVar9;
      for (err._4_4_ = 0; pLVar9 = ___autoNestedHandledExceptionType, err._4_4_ < iVar3;
          err._4_4_ = err._4_4_ + 1) {
        item = JsUtil::
               List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(stackTraceIn,err._4_4_);
        JsUtil::
        List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(pLVar9,item);
      }
      BVar5 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x59b,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                           "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_40);
    }
    stackTraceIn_local = ___autoNestedHandledExceptionType;
  }
  return stackTraceIn_local;
}

Assistant:

JavascriptExceptionContext::StackTrace* JavascriptExceptionOperators::TrimStackTraceForThrownObject(JavascriptExceptionContext::StackTrace* stackTraceIn, Var thrownObject, ScriptContext& scriptContext)
    {
        Assert(CrawlStackForWER(scriptContext)); // Don't trim if crawl for Error.stack
        Assert(stackTraceIn);

        int stackTraceLimit = static_cast<int>(GetStackTraceLimit(thrownObject, &scriptContext));
        Assert(stackTraceLimit == 0 || IsErrorInstance(thrownObject));

        if (stackTraceIn->Count() <= stackTraceLimit)
        {
            return stackTraceIn;
        }

        JavascriptExceptionContext::StackTrace* stackTraceTrimmed = NULL;
        if (stackTraceLimit > 0)
        {
            HRESULT hr;
            BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
            {
                stackTraceTrimmed = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
                for (int i = 0; i < stackTraceLimit; i++)
                {
                    stackTraceTrimmed->Add(stackTraceIn->Item(i));
                }
            }
            END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_INSCRIPT(hr);
        }